

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall discordpp::ResolvedData::~ResolvedData(ResolvedData *this)

{
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
  ::~unique_ptr(&(this->attachments).
                 super_field<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>_>_>
  ::~unique_ptr(&(this->messages).
                 super_field<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>_>_>
  ::~unique_ptr(&(this->channels).
                 super_field<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>_>_>
  ::~unique_ptr(&(this->roles).
                 super_field<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>_>_>
  ::~unique_ptr(&(this->members).
                 super_field<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>_>
                 .t_);
  std::
  unique_ptr<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
  ::~unique_ptr(&(this->users).
                 super_field<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>
                 .t_);
  return;
}

Assistant:

ResolvedData(
        omittable_field<std::map<Snowflake, User> > users = omitted,
        omittable_field<std::map<Snowflake, GuildMember> > members = omitted,
        omittable_field<std::map<Snowflake, Role> > roles = omitted,
        omittable_field<std::map<Snowflake, Channel> > channels = omitted,
        omittable_field<std::map<Snowflake, Message> > messages = omitted,
        omittable_field<std::map<Snowflake, Attachment> > attachments = omitted
    ):
        users(users),
        members(members),
        roles(roles),
        channels(channels),
        messages(messages),
        attachments(attachments)
    {}